

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O2

void __thiscall r_exec::Group::~Group(Group *this)

{
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
  super__Object._vptr__Object = (_func_int **)&PTR__Group_001d1c18;
  invalidate(this);
  std::_Vector_base<r_exec::Group::Operation_*,_std::allocator<r_exec::Group::Operation_*>_>::
  ~_Vector_base(&(this->pending_operations).
                 super__Vector_base<r_exec::Group::Operation_*,_std::allocator<r_exec::Group::Operation_*>_>
               );
  std::_Vector_base<r_exec::Controller_*,_std::allocator<r_exec::Controller_*>_>::~_Vector_base
            (&(this->new_controllers).
              super__Vector_base<r_exec::Controller_*,_std::allocator<r_exec::Controller_*>_>);
  std::
  _Rb_tree<core::P<r_exec::View>,_core::P<r_exec::View>,_std::_Identity<core::P<r_exec::View>_>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>
  ::~_Rb_tree(&(this->newly_salient_views)._M_t);
  std::
  _Hashtable<r_exec::Group_*,_std::pair<r_exec::Group_*const,_bool>,_std::allocator<std::pair<r_exec::Group_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<r_exec::Group_*>,_std::hash<r_exec::Group_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->viewing_groups)._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->other_views)._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->group_views)._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->notification_views)._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->input_less_ipgm_views)._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->anti_ipgm_views)._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->ipgm_views)._M_h);
  Object<r_code::LObject,_r_exec::LObject>::~Object
            ((Object<r_code::LObject,_r_exec::LObject> *)this);
  return;
}

Assistant:

Group::~Group()
{
    invalidate();
}